

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O1

stref idx2::GetParentPath(stref *Path)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  stref sVar4;
  
  lVar2 = (long)Path->Size;
  sVar4._8_8_ = lVar2;
  sVar4.field_0.Ptr = (Path->field_0).Ptr;
  lVar1 = lVar2 + -1;
  if (lVar2 != 0) {
    do {
      if ((Path->field_0).Ptr[lVar1] == '/') goto LAB_0019cc71;
      bVar3 = lVar1 != 0;
      lVar1 = lVar1 + -1;
    } while (bVar3);
    lVar1 = -1;
  }
LAB_0019cc71:
  if (lVar1 != -1) {
    sVar4 = SubString(Path,0,(int)lVar1);
  }
  return sVar4;
}

Assistant:

stref
GetParentPath(const stref& Path)
{
  idx2_Assert(!Contains(Path, '\\'));
  cstr LastSlash = FindLast(RevBegin(Path), RevEnd(Path), '/');
  if (LastSlash != RevEnd(Path))
    return SubString(Path, 0, int(LastSlash - Begin(Path)));

  return Path;
}